

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

string * __thiscall
kratos::get_var_size_str_abi_cxx11_(string *__return_storage_ptr__,kratos *this,Var *var)

{
  const_iterator cVar1;
  Var *var_00;
  ulong uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint uVar3;
  string_view format_str;
  format_args args;
  ulong local_78 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  string *local_38;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = __return_storage_ptr__;
  if (*(long *)(this + 0xa8) != *(long *)(this + 0xa0)) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_58._M_dataplus._M_p._0_4_ = uVar3 - 1;
      cVar1 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 0xb8),(key_type *)&local_58);
      if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
          _M_cur == (__node_type *)0x0) {
LAB_001bbfdd:
        local_78[0] = (ulong)(*(int *)(*(long *)(this + 0xa0) + uVar2 * 4) - 1);
        format_str.size_ = 2;
        format_str.data_ = (char *)0x7;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_78;
        fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)"[{0}:0]",format_str,args);
        std::__cxx11::string::_M_append
                  ((char *)local_38,
                   CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p));
      }
      else {
        cVar1 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(this + 0xb8),(key_type *)&local_58);
        if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
            _M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        if (*(SystemVerilogCodeGen **)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
                    _M_cur + 0x10) == (SystemVerilogCodeGen *)0x0) goto LAB_001bbfdd;
        SystemVerilogCodeGen::get_width_str_abi_cxx11_
                  (&local_58,
                   *(SystemVerilogCodeGen **)
                    ((long)cVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                           ._M_cur + 0x10),var_00);
        std::__cxx11::string::_M_append
                  ((char *)local_38,
                   CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < (ulong)(*(long *)(this + 0xa8) - *(long *)(this + 0xa0) >> 2));
  }
  return local_38;
}

Assistant:

std::string get_var_size_str(Var* var) {
    std::string str;
    for (uint32_t i = 0; i < var->size().size(); i++) {
        auto* p = var->get_size_param(i);
        if (p)
            str.append(SystemVerilogCodeGen::get_width_str(p));
        else
            str.append(SystemVerilogCodeGen::get_width_str(var->size()[i]));
    }
    return str;
}